

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_SetLastCutIsContained(Lf_Cut_t **pCuts,int nCuts)

{
  Lf_Cut_t *pCut;
  Lf_Cut_t *pBase;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < nCuts) {
    uVar2 = (ulong)(uint)nCuts;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar2 == uVar3) {
      return 0;
    }
    pCut = pCuts[uVar3];
    pBase = pCuts[nCuts];
    if ((((byte)pCut->field_0x17 <= (byte)pBase->field_0x17) && ((pCut->Sign & ~pBase->Sign) == 0))
       && (iVar1 = Lf_SetCutIsContainedOrder(pBase,pCut), iVar1 != 0)) break;
    uVar3 = uVar3 + 1;
  }
  return 1;
}

Assistant:

static inline int Lf_SetLastCutIsContained( Lf_Cut_t ** pCuts, int nCuts )
{
    int i;
    for ( i = 0; i < nCuts; i++ )
        if ( pCuts[i]->nLeaves <= pCuts[nCuts]->nLeaves && (pCuts[i]->Sign & pCuts[nCuts]->Sign) == pCuts[i]->Sign && Lf_SetCutIsContainedOrder(pCuts[nCuts], pCuts[i]) )
            return 1;
    return 0;
}